

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execTasRg<(moira::Instr)124,(moira::Mode)0,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  ushort in_SI;
  Moira *in_RDI;
  u32 data;
  u32 ea;
  int dst;
  u32 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint local_18;
  int in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff4;
  
  (*in_RDI->_vptr_Moira[0xb])();
  readOp<(moira::Mode)0,(moira::Size)1,0ul>
            ((Moira *)(CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,(uint)in_SI)) &
                      0xffffffff00000007),in_stack_ffffffffffffffec,(u32 *)in_RDI,
             (u32 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bVar1 = NBIT<(moira::Size)1>((ulong)local_18);
  (in_RDI->reg).sr.n = bVar1;
  bVar1 = ZERO<(moira::Size)1>((ulong)local_18);
  (in_RDI->reg).sr.z = bVar1;
  (in_RDI->reg).sr.v = false;
  (in_RDI->reg).sr.c = false;
  writeD<(moira::Size)1>(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  prefetch<4ul>(in_RDI);
  return;
}

Assistant:

void
Moira::execTasRg(u16 opcode)
{
    signalTAS();
    
    int dst = ( _____________xxx(opcode) );

    u32 ea, data;
    readOp<M,Byte>(dst, ea, data);

    reg.sr.n = NBIT<Byte>(data);
    reg.sr.z = ZERO<Byte>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    data |= 0x80;
    writeD<S>(dst, data);

    prefetch<POLLIPL>();
}